

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_flow.h
# Opt level: O0

void __thiscall max_flow_algo::discharge(max_flow_algo *this,NodeID node)

{
  NodeID node_00;
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  int local_18;
  NodeID target;
  int i;
  NodeID node_local;
  max_flow_algo *this_local;
  
  local_18 = 0;
  while( true ) {
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](this->adj,(long)node);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
    bVar1 = false;
    if ((ulong)(long)local_18 < sVar3) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_excess,(long)node);
      bVar1 = 0 < *pvVar4;
    }
    if (!bVar1) break;
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](this->adj,(long)node);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_18);
    node_00 = *pvVar4;
    bVar1 = isActive(this,node_00);
    if (bVar1) {
      push(this,node,node_00,local_18);
    }
    local_18 = local_18 + 1;
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_excess,(long)node);
  if (0 < *pvVar4) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_distance,(long)node);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_count,(long)*pvVar4);
    if ((*pvVar4 == 1) &&
       (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_distance,(long)node),
       *pvVar4 < this->rn)) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_distance,(long)node);
      gap_heuristic(this,*pvVar4);
    }
    else {
      relabel(this,node);
    }
  }
  return;
}

Assistant:

void discharge(NodeID node)
    {

        for (int i = 0; i < adj[node].size() && m_excess[node] > 0; i++)
        {
            NodeID target = adj[node][i];
            if (isActive(target))
                push(node, target, i);
        }

        if (m_excess[node] > 0)
        {
            if (m_count[m_distance[node]] == 1 && m_distance[node] < rn)
            {
                // hence this layer will be empty after the relabel step
                gap_heuristic(m_distance[node]);
            }
            else
            {
                relabel(node);
            }
        }
    }